

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::C_EncryptFinal
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pEncryptedData,
          CK_ULONG_PTR pulEncryptedDataLen)

{
  CK_ULONG CVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Session *this_00;
  SymmetricAlgorithm *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  uchar *__src;
  ulong uVar9;
  CK_RV CVar10;
  ByteString local_58;
  undefined4 extraout_var_01;
  
  if (this->isInitialised != true) {
    return 400;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  if (pulEncryptedDataLen == (CK_ULONG_PTR)0x0) {
    Session::resetOp(this_00);
    return 7;
  }
  iVar3 = Session::getOpType(this_00);
  if (iVar3 != 2) {
    return 0x91;
  }
  pSVar5 = Session::getSymmetricCryptoOp(this_00);
  if (pSVar5 == (SymmetricAlgorithm *)0x0) {
    return 0x54;
  }
  pSVar5 = Session::getSymmetricCryptoOp(this_00);
  if ((pSVar5 == (SymmetricAlgorithm *)0x0) ||
     (bVar2 = Session::getAllowMultiPartOp(this_00), !bVar2)) {
    Session::resetOp(this_00);
    return 0x91;
  }
  iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0x10])(pSVar5);
  iVar4 = (*pSVar5->_vptr_SymmetricAlgorithm[0x11])(pSVar5);
  uVar9 = CONCAT44(extraout_var_00,iVar4) + CONCAT44(extraout_var,iVar3);
  iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0x13])(pSVar5);
  if ((char)iVar3 != '\0') {
    iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0xd])(pSVar5);
    uVar6 = CONCAT44(extraout_var_01,iVar3);
    iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0xf])(pSVar5);
    if (((char)iVar3 == '\0') && (uVar9 % uVar6 != 0)) {
      Session::resetOp(this_00);
      softHSMLog(7,"SymEncryptFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xaf3,
                 "Remaining buffer size is not an integral of the block size. Block size: %#2x  Remaining size: %#2x"
                 ,uVar6,uVar9);
      return 0x21;
    }
    if ((char)iVar3 != '\0') {
      uVar9 = (uVar6 + uVar9) - (uVar6 + uVar9) % uVar6;
    }
  }
  if (pEncryptedData == (CK_BYTE_PTR)0x0) {
    *pulEncryptedDataLen = uVar9;
    return 0;
  }
  if (*pulEncryptedDataLen < uVar9) {
    softHSMLog(7,"SymEncryptFinal",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0xb05,"output buffer size: %#5x  size: %#5x",*pulEncryptedDataLen,uVar9);
    *pulEncryptedDataLen = uVar9;
    return 0x150;
  }
  ByteString::ByteString(&local_58);
  iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[4])(pSVar5,&local_58);
  if ((char)iVar3 == '\0') {
    Session::resetOp(this_00);
  }
  else {
    CVar1 = *pulEncryptedDataLen;
    sVar7 = ByteString::size(&local_58);
    softHSMLog(7,"SymEncryptFinal",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0xb12,"output buffer size: %#2x  size: %#2x  encryptedFinal.size(): %#2x",CVar1,
               uVar9,sVar7);
    uVar9 = *pulEncryptedDataLen;
    sVar8 = ByteString::size(&local_58);
    if (sVar8 <= uVar9) {
      sVar7 = ByteString::size(&local_58);
      if (sVar7 != 0) {
        __src = ByteString::byte_str(&local_58);
        sVar7 = ByteString::size(&local_58);
        memcpy(pEncryptedData,__src,sVar7);
      }
      sVar7 = ByteString::size(&local_58);
      *pulEncryptedDataLen = sVar7;
      Session::resetOp(this_00);
      CVar10 = 0;
      goto LAB_001328be;
    }
    Session::resetOp(this_00);
    CVar1 = *pulEncryptedDataLen;
    sVar8 = ByteString::size(&local_58);
    softHSMLog(3,"SymEncryptFinal",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0xb19,
               "EncryptFinal returning too much data. Length of output data buffer is %i but %i bytes was returned by the encrypt."
               ,CVar1,sVar8,sVar7);
  }
  CVar10 = 5;
LAB_001328be:
  ByteString::~ByteString(&local_58);
  return CVar10;
}

Assistant:

CK_RV SoftHSM::C_EncryptFinal(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pEncryptedData, CK_ULONG_PTR pulEncryptedDataLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Github issue #469, check NULL_PTR on pulEncryptedDataLen
	if (pulEncryptedDataLen == NULL)
	{
		session->resetOp();
		return CKR_ARGUMENTS_BAD;
	}

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_ENCRYPT) return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getSymmetricCryptoOp() != NULL)
		return SymEncryptFinal(session, pEncryptedData, pulEncryptedDataLen);
	else
		return CKR_FUNCTION_NOT_SUPPORTED;
}